

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

bool __thiscall PArray::ReadValue(PArray *this,FArchive *ar,void *addr)

{
  DWORD a;
  uint uVar1;
  void *local_40;
  BYTE *addrb;
  uint i;
  uint count;
  BYTE tag;
  bool readsomething;
  void *addr_local;
  FArchive *ar_local;
  PArray *this_local;
  
  i._3_1_ = 0;
  _count = addr;
  addr_local = ar;
  ar_local = (FArchive *)this;
  FArchive::operator<<(ar,(BYTE *)((long)&i + 2));
  if (i._2_1_ == 0xf) {
    a = FArchive::ReadCount((FArchive *)addr_local);
    local_40 = _count;
    for (addrb._4_4_ = 0; uVar1 = MIN<unsigned_int>(a,this->ElementCount), addrb._4_4_ < uVar1;
        addrb._4_4_ = addrb._4_4_ + 1) {
      uVar1 = (*(this->ElementType->super_DObject)._vptr_DObject[8])
                        (this->ElementType,addr_local,local_40);
      i._3_1_ = (i._3_1_ & 1) != 0 || (uVar1 & 1) != 0;
      local_40 = (void *)((long)local_40 + (ulong)this->ElementSize);
    }
    if (addrb._4_4_ < this->ElementCount) {
      DPrintf(2,"Array on disk (%u) is bigger than in memory (%u)\n",(ulong)a,
              (ulong)this->ElementCount);
      for (; addrb._4_4_ < this->ElementCount; addrb._4_4_ = addrb._4_4_ + 1) {
        PType::SkipValue((FArchive *)addr_local);
      }
    }
    this_local._7_1_ = (bool)(i._3_1_ & 1);
  }
  else {
    PType::SkipValue((FArchive *)addr_local,(uint)i._2_1_);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool PArray::ReadValue(FArchive &ar, void *addr) const
{
	bool readsomething = false;
	BYTE tag;

	ar << tag;
	if (tag == VAL_Array)
	{
		unsigned count = ar.ReadCount();
		unsigned i;
		BYTE *addrb = (BYTE *)addr;
		for (i = 0; i < MIN(count, ElementCount); ++i)
		{
			readsomething |= ElementType->ReadValue(ar, addrb);
			addrb += ElementSize;
		}
		if (i < ElementCount)
		{
			DPrintf(DMSG_WARNING, "Array on disk (%u) is bigger than in memory (%u)\n",
				count, ElementCount);
			for (; i < ElementCount; ++i)
			{
				SkipValue(ar);
			}
		}
		return readsomething;
	}
	SkipValue(ar, tag);
	return false;
}